

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto-simplification.cpp
# Opt level: O0

void __thiscall autoSimplification_power1_Test::TestBody(autoSimplification_power1_Test *this)

{
  bool bVar1;
  char *message;
  ExprPtr *ex;
  AssertHelper local_e8;
  Message local_e0;
  string local_d8;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  ExprPtr local_98;
  undefined1 local_88 [8];
  ExprPtr e;
  string local_70;
  undefined1 local_50 [8];
  ExprPtr x;
  undefined1 local_30 [8];
  ExprPtr n3;
  ExprPtr n2;
  autoSimplification_power1_Test *this_local;
  
  mathiu::impl::operator____i
            ((impl *)&n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,2);
  mathiu::impl::operator____i((impl *)local_30,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"x",
             (allocator<char> *)
             ((long)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::symbol((impl *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&e.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  mathiu::impl::operator^
            ((impl *)&local_98,(ExprPtr *)local_50,
             (ExprPtr *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  mathiu::impl::operator^((impl *)&gtest_ar.message_,(ExprPtr *)local_50,(ExprPtr *)local_30);
  mathiu::impl::operator*((impl *)local_88,&local_98,(ExprPtr *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)&gtest_ar.message_);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr(&local_98);
  mathiu::impl::toString_abi_cxx11_(&local_d8,(impl *)local_88,ex);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[8],_nullptr>
            ((EqHelper *)local_b8,"toString(e)","\"(^ x 5)\"",&local_d8,(char (*) [8])"(^ x 5)");
  std::__cxx11::string::~string((string *)&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/auto-simplification.cpp"
               ,0x185,message);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_88);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_50);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)local_30);
  std::shared_ptr<const_mathiu::impl::Expr>::~shared_ptr
            ((shared_ptr<const_mathiu::impl::Expr> *)
             &n3.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(autoSimplification, power1)
{
    auto const n2 = 2_i;
    auto const n3 = 3_i;
    auto const x = symbol("x");
    auto const e = (x ^ n2) * (x ^ n3);
    EXPECT_EQ(toString(e), "(^ x 5)");
}